

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&>::operator>=
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&> *this,
          span<int,_18446744073709551615UL> *rhs)

{
  uint uVar1;
  lest *this_00;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  span<int,_18446744073709551615UL> *in_R8;
  bool bVar8;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  bool local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  span<int,_18446744073709551615UL> local_70;
  int local_60 [4];
  string local_50;
  
  this_00 = *(lest **)this;
  puVar2 = (uint *)rhs->data_;
  uVar3 = rhs->size_;
  uVar4 = *(ulong *)(this_00 + 8);
  if ((long)uVar3 < (long)*(ulong *)(this_00 + 8)) {
    uVar4 = uVar3;
  }
  puVar6 = puVar2;
  if ((uVar4 & 0x3fffffffffffffff) != 0) {
    puVar7 = *(uint **)this_00;
    puVar5 = puVar7 + uVar4;
    do {
      uVar1 = *puVar7;
      in_R8 = (span<int,_18446744073709551615UL> *)(ulong)uVar1;
      if (*puVar6 != uVar1) {
        bVar8 = (int)uVar1 < (int)*puVar6;
        goto LAB_0019a3fe;
      }
      puVar7 = puVar7 + 1;
      puVar6 = puVar6 + 1;
    } while (puVar7 != puVar5);
  }
  bVar8 = puVar6 != puVar2 + uVar3;
LAB_0019a3fe:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,">=","");
  local_70.data_ = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d8,local_d8 + local_d0);
  to_string<nonstd::span_lite::span<int,18446744073709551615ul>,nonstd::span_lite::span<int,18446744073709551615ul>>
            (&local_50,this_00,&local_70,(string *)rhs,in_R8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_98 = (bool)(bVar8 ^ 1);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b8,local_b8 + local_b0);
  __return_storage_ptr__->passed = local_98;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_90,local_90 + local_88);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70.data_ != local_60) {
    operator_delete(local_70.data_);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }